

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O0

void __thiscall perlin::perlin(perlin *this)

{
  vec3 *pvVar1;
  perlin *local_50;
  vec3 local_48;
  vec3 local_30;
  int local_14;
  perlin *ppStack_10;
  int i;
  perlin *this_local;
  
  local_50 = this;
  ppStack_10 = this;
  do {
    vec3::vec3(local_50->randvec);
    local_50 = (perlin *)(local_50->randvec + 1);
  } while (local_50 != (perlin *)this->perm_x);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    vec3::random();
    unit_vector(&local_30,&local_48);
    pvVar1 = this->randvec + local_14;
    pvVar1->e[0] = local_30.e[0];
    pvVar1->e[1] = local_30.e[1];
    pvVar1->e[2] = local_30.e[2];
  }
  perlin_generate_perm(this->perm_x);
  perlin_generate_perm(this->perm_y);
  perlin_generate_perm(this->perm_z);
  return;
}

Assistant:

perlin() {
        for (int i = 0; i < point_count; i++) {
            randvec[i] = unit_vector(vec3::random(-1,1));
        }

        perlin_generate_perm(perm_x);
        perlin_generate_perm(perm_y);
        perlin_generate_perm(perm_z);
    }